

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

void __thiscall implementations::scheme::environment::~environment(environment *this)

{
  environment *this_local;
  
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&this->outer_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
  ::~map(&this->env_);
  stackless::
  Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ::~Environment(&this->
                  super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                );
  return;
}

Assistant:

environment(env_p outer = nullptr) : outer_(outer) {}